

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmemory.c
# Opt level: O3

int cLUWorkInit(int m,int n,int panel_size,int **iworkptr,singlecomplex **dworkptr,GlobalLU_t *Glu)

{
  int_t *piVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int *piVar5;
  singlecomplex *psVar6;
  int iVar7;
  singlecomplex *psVar8;
  int iVar9;
  
  iVar2 = sp_ienv(3);
  iVar3 = sp_ienv(7);
  iVar2 = sp_ienv((uint)(iVar2 <= iVar3) * 4 + 3);
  iVar3 = sp_ienv(4);
  iVar9 = (panel_size * 2 + 5) * m * 4;
  iVar2 = (iVar3 + iVar2) * panel_size;
  if (iVar2 <= m) {
    iVar2 = m;
  }
  if (Glu->MemModel == SYSTEM) {
    piVar5 = int32Calloc(iVar9 >> 2);
  }
  else {
    iVar3 = (Glu->stack).used + iVar9;
    if ((Glu->stack).size <= iVar3) {
      *iworkptr = (int *)0x0;
      goto LAB_0010b522;
    }
    lVar4 = (long)(Glu->stack).top2 - (long)iVar9;
    (Glu->stack).top2 = (int_t)lVar4;
    piVar5 = (int *)(lVar4 + (long)(Glu->stack).array);
    (Glu->stack).used = iVar3;
  }
  *iworkptr = piVar5;
  if (piVar5 != (int *)0x0) {
    iVar2 = (iVar2 + panel_size * m) * 8;
    if (Glu->MemModel == SYSTEM) {
      psVar6 = (singlecomplex *)superlu_malloc((long)iVar2);
      *dworkptr = psVar6;
    }
    else {
      iVar3 = (Glu->stack).used;
      iVar7 = iVar3 + iVar2;
      if (iVar7 < (Glu->stack).size) {
        lVar4 = (long)(Glu->stack).top2 - (long)iVar2;
        (Glu->stack).top2 = (int_t)lVar4;
        psVar6 = (singlecomplex *)(lVar4 + (long)(Glu->stack).array);
        (Glu->stack).used = iVar7;
        iVar3 = iVar7;
      }
      else {
        psVar6 = (singlecomplex *)0x0;
      }
      *dworkptr = psVar6;
      if (((ulong)psVar6 & 7) != 0) {
        psVar8 = (singlecomplex *)(((ulong)((long)&psVar6->i + 3U) & 0xfffffffffffffff8) - 8);
        *dworkptr = psVar8;
        iVar2 = (int)psVar6 - (int)psVar8;
        piVar1 = &(Glu->stack).top2;
        *piVar1 = *piVar1 - iVar2;
        (Glu->stack).used = iVar3 + iVar2;
        return 0;
      }
    }
    if (psVar6 != (singlecomplex *)0x0) {
      return 0;
    }
    fwrite("malloc fails for local dworkptr[].",0x22,1,_stderr);
    return iVar9 + n + iVar2;
  }
LAB_0010b522:
  fwrite("cLUWorkInit: malloc fails for local iworkptr[]\n",0x2f,1,_stderr);
  return iVar9 + n;
}

Assistant:

int
cLUWorkInit(int m, int n, int panel_size, int **iworkptr, 
            singlecomplex **dworkptr, GlobalLU_t *Glu)
{
    int    isize, dsize, extra;
    singlecomplex *old_ptr;
    int    maxsuper = SUPERLU_MAX( sp_ienv(3), sp_ienv(7) ),
           rowblk   = sp_ienv(4);

    /* xplore[m] and xprune[n] can be 64-bit; they are allocated separately */
    //isize = ( (2 * panel_size + 3 + NO_MARKER ) * m + n ) * sizeof(int);
    isize = ( (2 * panel_size + 2 + NO_MARKER ) * m ) * sizeof(int);
    dsize = (m * panel_size +
	     NUM_TEMPV(m,panel_size,maxsuper,rowblk)) * sizeof(singlecomplex);
    
    if ( Glu->MemModel == SYSTEM ) 
	*iworkptr = (int *) int32Calloc(isize/sizeof(int));
    else
	*iworkptr = (int *) cuser_malloc(isize, TAIL, Glu);
    if ( ! *iworkptr ) {
	fprintf(stderr, "cLUWorkInit: malloc fails for local iworkptr[]\n");
	return (isize + n);
    }

    if ( Glu->MemModel == SYSTEM )
	*dworkptr = (singlecomplex *) SUPERLU_MALLOC(dsize);
    else {
	*dworkptr = (singlecomplex *) cuser_malloc(dsize, TAIL, Glu);
	if ( NotDoubleAlign(*dworkptr) ) {
	    old_ptr = *dworkptr;
	    *dworkptr = (singlecomplex*) DoubleAlign(*dworkptr);
	    *dworkptr = (singlecomplex*) ((double*)*dworkptr - 1);
	    extra = (char*)old_ptr - (char*)*dworkptr;
#if ( DEBUGlevel>=1 )
	    printf("cLUWorkInit: not aligned, extra %d\n", extra); fflush(stdout);
#endif	    
	    Glu->stack.top2 -= extra;
	    Glu->stack.used += extra;
	}
    }
    if ( ! *dworkptr ) {
	fprintf(stderr, "malloc fails for local dworkptr[].");
	return (isize + dsize + n);
    }
	
    return 0;
}